

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O2

Vector3<double> * phyr::cross<double>(Normal3<double> *n,Vector3<double> *v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  Vector3<double> *in_RDI;
  
  dVar1 = n->x;
  dVar2 = v->x;
  dVar3 = n->y;
  dVar4 = n->z;
  dVar5 = v->y;
  dVar6 = v->z;
  in_RDI->x = dVar6 * dVar3 - dVar4 * dVar5;
  in_RDI->y = dVar2 * dVar4 - dVar1 * dVar6;
  in_RDI->z = dVar1 * dVar5 - dVar2 * dVar3;
  return in_RDI;
}

Assistant:

inline Vector3<T> cross(const Normal3<T>& n, const Vector3<T>& v) {
    ASSERT(!n.hasNaNs() && !v.hasNaNs());
    double x1 = n.x, y1 = n.y, z1 = n.z;
    double x2 = v.x, y2 = v.y, z2 = v.z;
    return Vector3<T>((y1 * z2 - z1 * y2), (z1 * x2 - x1 * z2), (x1 * y2 - y1 * x2));
}